

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O0

CURLcode glob_range(URLGlob *glob,char **patternp,size_t *posp,unsigned_long *amount,int globindex)

{
  char *pcVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  char *local_90;
  char *endp_1;
  unsigned_long step_n;
  unsigned_long max_n;
  unsigned_long min_n;
  char *endp;
  unsigned_long step;
  char end_c;
  char max_c;
  byte *pbStack_58;
  char min_c;
  char *c;
  char *pattern;
  URLPattern *pUStack_40;
  int rc;
  URLPattern *pat;
  unsigned_long *puStack_30;
  int globindex_local;
  unsigned_long *amount_local;
  size_t *posp_local;
  char **patternp_local;
  URLGlob *glob_local;
  
  c = *patternp;
  pUStack_40 = glob->pattern + glob->size;
  pUStack_40->globindex = globindex;
  pat._4_4_ = globindex;
  puStack_30 = amount;
  amount_local = posp;
  posp_local = (size_t *)patternp;
  patternp_local = (char **)glob;
  iVar2 = Curl_isalpha((uint)(byte)*c);
  if (iVar2 == 0) {
    iVar2 = Curl_isdigit((uint)(byte)*c);
    if (iVar2 == 0) {
      patternp_local[0x25c] = "bad range specification";
      patternp_local[0x25d] = (char *)*amount_local;
      return CURLE_URL_MALFORMAT;
    }
    step_n = 0;
    endp_1 = (char *)0x0;
    pUStack_40->type = UPTNumRange;
    (pUStack_40->content).NumRange.padlength = 0;
    if (*c == '0') {
      pbStack_58 = (byte *)c;
      while (iVar2 = Curl_isdigit((uint)*pbStack_58), iVar2 != 0) {
        pbStack_58 = pbStack_58 + 1;
        (pUStack_40->content).NumRange.padlength = (pUStack_40->content).NumRange.padlength + 1;
      }
    }
    piVar3 = __errno_location();
    *piVar3 = 0;
    max_n = strtoul(c,&local_90,10);
    piVar3 = __errno_location();
    if ((*piVar3 == 0) && (local_90 != c)) {
      pcVar1 = local_90;
      if (*local_90 == '-') {
        do {
          c = pcVar1 + 1;
          bVar4 = false;
          if ((*c != '\0') && (bVar4 = true, *c != ' ')) {
            bVar4 = *c == '\t';
          }
          pcVar1 = c;
        } while (bVar4);
        iVar2 = Curl_isdigit((uint)(byte)*c);
        if (iVar2 == 0) {
          local_90 = (char *)0x0;
        }
        else {
          piVar3 = __errno_location();
          *piVar3 = 0;
          step_n = strtoul(c,&local_90,10);
          piVar3 = __errno_location();
          if (*piVar3 == 0) {
            if (*local_90 == ':') {
              c = local_90 + 1;
              piVar3 = __errno_location();
              *piVar3 = 0;
              endp_1 = (char *)strtoul(c,&local_90,10);
              piVar3 = __errno_location();
              if (*piVar3 != 0) {
                local_90 = (char *)0x0;
              }
            }
            else {
              endp_1 = (char *)0x1;
            }
          }
          else {
            local_90 = (char *)0x0;
          }
          if ((local_90 == (char *)0x0) || (*local_90 != ']')) {
            local_90 = (char *)0x0;
          }
          else {
            c = local_90 + 1;
          }
        }
      }
      else {
        local_90 = (char *)0x0;
      }
    }
    else {
      local_90 = (char *)0x0;
    }
    *amount_local = (unsigned_long)(c + (*amount_local - *posp_local));
    if ((((local_90 == (char *)0x0) || (endp_1 == (char *)0x0)) ||
        ((max_n == step_n && (endp_1 != (char *)0x1)))) ||
       ((max_n != step_n && ((step_n < max_n || ((char *)(step_n - max_n) < endp_1)))))) {
      patternp_local[0x25c] = "bad range";
      patternp_local[0x25d] = (char *)*amount_local;
      return CURLE_URL_MALFORMAT;
    }
    (pUStack_40->content).NumRange.min_n = max_n;
    (pUStack_40->content).NumRange.ptr_n = max_n;
    (pUStack_40->content).NumRange.max_n = step_n;
    (pUStack_40->content).NumRange.step = (unsigned_long)endp_1;
    iVar2 = multiply(puStack_30,
                     ((pUStack_40->content).NumRange.max_n - (pUStack_40->content).NumRange.min_n) /
                     (pUStack_40->content).NumRange.step + 1);
    if (iVar2 != 0) {
      patternp_local[0x25c] = "range overflow";
      patternp_local[0x25d] = (char *)*amount_local;
      return CURLE_URL_MALFORMAT;
    }
  }
  else {
    endp = (char *)0x1;
    pUStack_40->type = UPTCharRange;
    pattern._4_4_ = __isoc99_sscanf(c,"%c-%c%c",(long)&step + 7,(long)&step + 6,(long)&step + 5);
    if (pattern._4_4_ == 3) {
      if (step._5_1_ == ':') {
        piVar3 = __errno_location();
        *piVar3 = 0;
        endp = (char *)strtoul(c + 4,(char **)&min_n,10);
        piVar3 = __errno_location();
        if (((*piVar3 == 0) && (c + 4 != (char *)min_n)) && (*(char *)min_n == ']')) {
          c = (char *)(min_n + 1);
        }
        else {
          endp = (char *)0x0;
        }
      }
      else if (step._5_1_ == ']') {
        c = c + 4;
      }
      else {
        pattern._4_4_ = 0;
      }
    }
    *amount_local = (unsigned_long)(c + (*amount_local - *posp_local));
    if ((((pattern._4_4_ != 3) || (endp == (char *)0x0)) ||
        (((char *)0x7fffffff < endp || ((step._7_1_ == step._6_1_ && (endp != (char *)0x1)))))) ||
       ((step._7_1_ != step._6_1_ &&
        (((step._6_1_ < step._7_1_ ||
          ((char *)(ulong)(uint)((int)step._6_1_ - (int)step._7_1_) < endp)) ||
         (0x19 < (int)step._6_1_ - (int)step._7_1_)))))) {
      patternp_local[0x25c] = "bad range";
      patternp_local[0x25d] = (char *)*amount_local;
      return CURLE_URL_MALFORMAT;
    }
    (pUStack_40->content).CharRange.step = (int)endp;
    (pUStack_40->content).CharRange.min_c = step._7_1_;
    (pUStack_40->content).CharRange.ptr_c = step._7_1_;
    (pUStack_40->content).CharRange.max_c = step._6_1_;
    iVar2 = multiply(puStack_30,
                     (long)(((int)(pUStack_40->content).CharRange.max_c -
                            (int)(pUStack_40->content).CharRange.min_c) /
                            (pUStack_40->content).CharRange.step + 1));
    if (iVar2 != 0) {
      patternp_local[0x25c] = "range overflow";
      patternp_local[0x25d] = (char *)*amount_local;
      return CURLE_URL_MALFORMAT;
    }
  }
  *posp_local = (size_t)c;
  return CURLE_OK;
}

Assistant:

static CURLcode glob_range(URLGlob *glob, char **patternp,
                           size_t *posp, unsigned long *amount,
                           int globindex)
{
  /* processes a range expression with the point behind the opening '['
     - char range: e.g. "a-z]", "B-Q]"
     - num range: e.g. "0-9]", "17-2000]"
     - num range with leading zeros: e.g. "001-999]"
     expression is checked for well-formedness and collected until the next ']'
  */
  URLPattern *pat;
  int rc;
  char *pattern = *patternp;
  char *c;

  pat = &glob->pattern[glob->size];
  pat->globindex = globindex;

  if(ISALPHA(*pattern)) {
    /* character range detected */
    char min_c;
    char max_c;
    char end_c;
    unsigned long step = 1;

    pat->type = UPTCharRange;

    rc = sscanf(pattern, "%c-%c%c", &min_c, &max_c, &end_c);

    if(rc == 3) {
      if(end_c == ':') {
        char *endp;
        errno = 0;
        step = strtoul(&pattern[4], &endp, 10);
        if(errno || &pattern[4] == endp || *endp != ']')
          step = 0;
        else
          pattern = endp + 1;
      }
      else if(end_c != ']')
        /* then this is wrong */
        rc = 0;
      else
        /* end_c == ']' */
        pattern += 4;
    }

    *posp += (pattern - *patternp);

    if(rc != 3 || !step || step > (unsigned)INT_MAX ||
       (min_c == max_c && step != 1) ||
       (min_c != max_c && (min_c > max_c || step > (unsigned)(max_c - min_c) ||
                           (max_c - min_c) > ('z' - 'a'))))
      /* the pattern is not well-formed */
      return GLOBERROR("bad range", *posp, CURLE_URL_MALFORMAT);

    /* if there was a ":[num]" thing, use that as step or else use 1 */
    pat->content.CharRange.step = (int)step;
    pat->content.CharRange.ptr_c = pat->content.CharRange.min_c = min_c;
    pat->content.CharRange.max_c = max_c;

    if(multiply(amount, ((pat->content.CharRange.max_c -
                          pat->content.CharRange.min_c) /
                         pat->content.CharRange.step + 1)))
      return GLOBERROR("range overflow", *posp, CURLE_URL_MALFORMAT);
  }
  else if(ISDIGIT(*pattern)) {
    /* numeric range detected */
    unsigned long min_n;
    unsigned long max_n = 0;
    unsigned long step_n = 0;
    char *endp;

    pat->type = UPTNumRange;
    pat->content.NumRange.padlength = 0;

    if(*pattern == '0') {
      /* leading zero specified, count them! */
      c = pattern;
      while(ISDIGIT(*c)) {
        c++;
        ++pat->content.NumRange.padlength; /* padding length is set for all
                                              instances of this pattern */
      }
    }

    errno = 0;
    min_n = strtoul(pattern, &endp, 10);
    if(errno || (endp == pattern))
      endp = NULL;
    else {
      if(*endp != '-')
        endp = NULL;
      else {
        pattern = endp + 1;
        while(*pattern && ISBLANK(*pattern))
          pattern++;
        if(!ISDIGIT(*pattern)) {
          endp = NULL;
          goto fail;
        }
        errno = 0;
        max_n = strtoul(pattern, &endp, 10);
        if(errno)
          /* overflow */
          endp = NULL;
        else if(*endp == ':') {
          pattern = endp + 1;
          errno = 0;
          step_n = strtoul(pattern, &endp, 10);
          if(errno)
            /* over/underflow situation */
            endp = NULL;
        }
        else
          step_n = 1;
        if(endp && (*endp == ']')) {
          pattern = endp + 1;
        }
        else
          endp = NULL;
      }
    }

    fail:
    *posp += (pattern - *patternp);

    if(!endp || !step_n ||
       (min_n == max_n && step_n != 1) ||
       (min_n != max_n && (min_n > max_n || step_n > (max_n - min_n))))
      /* the pattern is not well-formed */
      return GLOBERROR("bad range", *posp, CURLE_URL_MALFORMAT);

    /* typecasting to ints are fine here since we make sure above that we
       are within 31 bits */
    pat->content.NumRange.ptr_n = pat->content.NumRange.min_n = min_n;
    pat->content.NumRange.max_n = max_n;
    pat->content.NumRange.step = step_n;

    if(multiply(amount, ((pat->content.NumRange.max_n -
                          pat->content.NumRange.min_n) /
                         pat->content.NumRange.step + 1)))
      return GLOBERROR("range overflow", *posp, CURLE_URL_MALFORMAT);
  }
  else
    return GLOBERROR("bad range specification", *posp, CURLE_URL_MALFORMAT);

  *patternp = pattern;
  return CURLE_OK;
}